

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

size_t __thiscall cmListFileBacktrace::Depth(cmListFileBacktrace *this)

{
  bool bVar1;
  Entry *local_20;
  Entry *cur;
  size_t depth;
  cmListFileBacktrace *this_local;
  
  cur = (Entry *)0x0;
  local_20 = std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                         *)this);
  if (local_20 != (element_type *)0x0) {
    while (bVar1 = Entry::IsBottom(local_20), ((bVar1 ^ 0xffU) & 1) != 0) {
      cur = (Entry *)&(cur->field_0).Context.Name.field_0x1;
      local_20 = std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::
                 get(&(local_20->Parent).
                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                    );
    }
  }
  return (size_t)cur;
}

Assistant:

size_t cmListFileBacktrace::Depth() const
{
  size_t depth = 0;
  if (Entry const* cur = this->TopEntry.get()) {
    for (; !cur->IsBottom(); cur = cur->Parent.get()) {
      ++depth;
    }
  }
  return depth;
}